

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O3

bool __thiscall
NurseSolution::isSingleAssignment(NurseSolution *this,Turn *turnToCheck,Turn *turnToIgnore)

{
  Turn **ppTVar1;
  bool bVar2;
  __normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> __it;
  long lVar3;
  long lVar4;
  __normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> _Var5;
  Turn **local_50;
  Turn **local_48;
  Turn *local_40;
  Turn *local_38;
  
  local_48 = &local_38;
  local_50 = &local_40;
  __it._M_current =
       (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  ppTVar1 = (this->turns).super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar4 = (long)ppTVar1 - (long)__it._M_current;
  local_40 = turnToIgnore;
  local_38 = turnToCheck;
  if (0 < lVar4 >> 5) {
    lVar3 = (lVar4 >> 5) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::$_0>::
              operator()((_Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::__0>
                          *)&local_50,__it);
      _Var5._M_current = __it._M_current;
      if (bVar2) goto LAB_00111ffe;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::$_0>::
              operator()((_Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::__0>
                          *)&local_50,
                         (__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                          )(__it._M_current + 1));
      _Var5._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_00111ffe;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::$_0>::
              operator()((_Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::__0>
                          *)&local_50,
                         (__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                          )(__it._M_current + 2));
      _Var5._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_00111ffe;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::$_0>::
              operator()((_Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::__0>
                          *)&local_50,
                         (__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                          )(__it._M_current + 3));
      _Var5._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_00111ffe;
      __it._M_current = __it._M_current + 4;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -0x20;
    } while (1 < lVar3);
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = ppTVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::$_0>::
                  operator()((_Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::__0>
                              *)&local_50,__it), _Var5._M_current = __it._M_current, bVar2))
      goto LAB_00111ffe;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::$_0>::
            operator()((_Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::__0>
                        *)&local_50,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_00111ffe;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::$_0>::
          operator()((_Iter_pred<NurseSolution::isSingleAssignment(Turn_const*,Turn_const*)const::__0>
                      *)&local_50,__it);
  _Var5._M_current = __it._M_current;
  if (!bVar2) {
    _Var5._M_current = ppTVar1;
  }
LAB_00111ffe:
  return _Var5._M_current == ppTVar1;
}

Assistant:

const bool NurseSolution::isSingleAssignment(const Turn *turnToCheck, const Turn *turnToIgnore) const {
    return none_of(begin(turns), end(turns), [&](Turn* turnElem) {
        if (turnToIgnore != nullptr && turnElem->getId() == turnToIgnore->getId())
            return false;
        return turnElem->getDay() == turnToCheck->getDay();
    });
}